

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTSizeType colorPixelSize(IceTEnum color_format)

{
  IceTSizeType local_c;
  IceTEnum color_format_local;
  
  if (color_format == 0xc000) {
    local_c = 0;
  }
  else if (color_format == 0xc001) {
    local_c = 4;
  }
  else if (color_format == 0xc002) {
    local_c = 0x10;
  }
  else {
    icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0xda);
    local_c = 0;
  }
  return local_c;
}

Assistant:

static IceTSizeType colorPixelSize(IceTEnum color_format)
{
    switch (color_format) {
      case ICET_IMAGE_COLOR_RGBA_UBYTE: return 4;
      case ICET_IMAGE_COLOR_RGBA_FLOAT: return 4*sizeof(IceTFloat);
      case ICET_IMAGE_COLOR_NONE:       return 0;
      default:
          icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
          return 0;
    }
}